

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,undefined4 param_2)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  
  switch(param_2) {
  case 0:
    cVar2 = 't';
    goto LAB_0012f761;
  case 1:
    cVar2 = 'f';
LAB_0012f761:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = cVar2;
    return this;
  case 2:
    cVar2 = 'h';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "dbhi"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 3:
    cVar2 = 'l';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbls"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 4:
    cVar2 = 'c';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "acc"[lVar3 + 2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 5:
    cVar2 = 'c';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbcs"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 6:
    cVar2 = 'n';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbne"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 7:
    cVar2 = 'e';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbeq"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 8:
    cVar2 = 'v';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "dbvc"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 9:
    cVar2 = 'v';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "dbvs"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 10:
    cVar2 = 'p';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "dbpl"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xb:
    cVar2 = 'm';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "dbmi"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xc:
    cVar2 = 'g';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbge"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xd:
    cVar2 = 'l';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "halt"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xe:
    cVar2 = 'g';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbgt"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xf:
    cVar2 = 'l';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "%le"[lVar3 + 2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cc cc)
{
    switch (Cond(cc.raw)) {

        case Cond::BT: *this << "t";   break;
        case Cond::BF: *this << "f";   break;
        case Cond::HI: *this << "hi";  break;
        case Cond::LS: *this << "ls";  break;
        case Cond::CC: *this << "cc";  break;
        case Cond::CS: *this << "cs";  break;
        case Cond::NE: *this << "ne";  break;
        case Cond::EQ: *this << "eq";  break;
        case Cond::VC: *this << "vc";  break;
        case Cond::VS: *this << "vs";  break;
        case Cond::PL: *this << "pl";  break;
        case Cond::MI: *this << "mi";  break;
        case Cond::GE: *this << "ge";  break;
        case Cond::LT: *this << "lt";  break;
        case Cond::GT: *this << "gt";  break;
        case Cond::LE: *this << "le";  break;
    }
    return *this;
}